

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O1

void helper_fsneg_m68k(CPUM68KState_conflict *env,FPReg_conflict *res,FPReg_conflict *val)

{
  char cVar1;
  floatx80 fVar2;
  
  cVar1 = (env->fp_status).floatx80_rounding_precision;
  (env->fp_status).floatx80_rounding_precision = ' ';
  fVar2._8_4_ = *(uint *)&(val->d).high ^ 0xffff8000;
  fVar2.low = (val->d).low;
  fVar2._12_4_ = 0;
  fVar2 = floatx80_round_m68k(fVar2,&env->fp_status);
  (res->d).low = fVar2.low;
  (res->d).high = fVar2.high;
  (env->fp_status).floatx80_rounding_precision = cVar1;
  return;
}

Assistant:

void HELPER(fsneg)(CPUM68KState *env, FPReg *res, FPReg *val)
{
    PREC_BEGIN(32);
    res->d = floatx80_round(floatx80_chs(val->d), &env->fp_status);
    PREC_END();
}